

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::require_numeric_argument(Arg *arg,char spec)

{
  FormatError *this;
  char spec_local;
  string message;
  
  if ((int)arg->type < 10) {
    return;
  }
  spec_local = spec;
  format<char>(&message,(CStringRef)0x10eba9,&spec_local);
  this = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this,(CStringRef)message._M_dataplus._M_p);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

inline void require_numeric_argument(const Arg &arg, char spec) {
  if (arg.type > Arg::LAST_NUMERIC_TYPE) {
    std::string message =
        fmt::format("format specifier '{}' requires numeric argument", spec);
    FMT_THROW(fmt::FormatError(message));
  }
}